

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fCopyImageTests.cpp
# Opt level: O0

void deqp::gles31::Functional::anon_unknown_0::decompressTextureLevel
               (TexDecompressionParams *params,ArrayBuffer<unsigned_char,_1UL,_1UL> *levelData,
               PixelBufferAccess *levelAccess,CompressedTexFormat *compressedFormat,
               TextureFormat *decompressedFormat,IVec3 *levelPixelSize,void *data)

{
  IVec3 *format;
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  void *data_00;
  PixelBufferAccess local_60;
  Vector<int,_3> *local_38;
  IVec3 *levelPixelSize_local;
  TextureFormat *decompressedFormat_local;
  CompressedTexFormat *compressedFormat_local;
  PixelBufferAccess *levelAccess_local;
  ArrayBuffer<unsigned_char,_1UL,_1UL> *levelData_local;
  TexDecompressionParams *params_local;
  
  local_38 = levelPixelSize;
  levelPixelSize_local = (IVec3 *)decompressedFormat;
  decompressedFormat_local = (TextureFormat *)compressedFormat;
  compressedFormat_local = (CompressedTexFormat *)levelAccess;
  levelAccess_local = (PixelBufferAccess *)levelData;
  levelData_local = (ArrayBuffer<unsigned_char,_1UL,_1UL> *)params;
  iVar1 = tcu::Vector<int,_3>::x(levelPixelSize);
  iVar2 = tcu::Vector<int,_3>::y(local_38);
  iVar3 = tcu::Vector<int,_3>::z(local_38);
  iVar4 = tcu::TextureFormat::getPixelSize((TextureFormat *)levelPixelSize_local);
  de::ArrayBuffer<unsigned_char,_1UL,_1UL>::setStorage
            (levelData,(long)(iVar1 * iVar2 * iVar3 * iVar4));
  format = levelPixelSize_local;
  iVar1 = tcu::Vector<int,_3>::x(local_38);
  iVar2 = tcu::Vector<int,_3>::y(local_38);
  iVar3 = tcu::Vector<int,_3>::z(local_38);
  data_00 = de::ArrayBuffer<unsigned_char,_1UL,_1UL>::getPtr
                      ((ArrayBuffer<unsigned_char,_1UL,_1UL> *)levelAccess_local);
  tcu::PixelBufferAccess::PixelBufferAccess
            (&local_60,(TextureFormat *)format,iVar1,iVar2,iVar3,data_00);
  memcpy(compressedFormat_local,&local_60,0x28);
  tcu::decompress((PixelBufferAccess *)compressedFormat_local,decompressedFormat_local->order,
                  (deUint8 *)data,(TexDecompressionParams *)levelData_local);
  return;
}

Assistant:

void decompressTextureLevel (const tcu::TexDecompressionParams&		params,
							 ArrayBuffer<deUint8>&					levelData,
							 tcu::PixelBufferAccess&				levelAccess,
							 const tcu::CompressedTexFormat&		compressedFormat,
							 const tcu::TextureFormat&				decompressedFormat,
							 const IVec3&							levelPixelSize,
							 const void*							data)
{
	levelData.setStorage(levelPixelSize.x() * levelPixelSize.y() * levelPixelSize.z() * decompressedFormat.getPixelSize());
	levelAccess = tcu::PixelBufferAccess(decompressedFormat, levelPixelSize.x(), levelPixelSize.y(), levelPixelSize.z(), levelData.getPtr());

	tcu::decompress(levelAccess, compressedFormat, (const deUint8*)data, params);
}